

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_t.cpp
# Opt level: O0

source_t * deci::AssembleProgram(source_t *__return_storage_ptr__,istream *input)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  runtime_error *this;
  undefined4 extraout_var;
  size_type sVar6;
  mapped_type *pmVar7;
  reference pcVar8;
  string *__x;
  pointer ppVar9;
  value_t *pvVar10;
  number_t local_140;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_128;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_120;
  iterator it;
  string_t *str;
  command_t *item;
  iterator __end1;
  iterator __begin1;
  source_t *__range1;
  value_t *local_e8;
  string local_e0 [8];
  string argToken;
  string local_c0 [8];
  string labelToken;
  value_type local_a0;
  opcode_t local_90;
  int local_8c;
  opcode_t opcode;
  string opcodeToken;
  undefined1 local_58 [8];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  labels;
  istream *input_local;
  source_t *result;
  
  labels._M_h._M_single_bucket._7_1_ = 0;
  std::vector<deci::command_t,_std::allocator<deci::command_t>_>::vector(__return_storage_ptr__);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *)local_58);
  do {
    bVar1 = std::ios::eof();
    if (((bVar1 ^ 0xff) & 1) == 0) break;
    std::__cxx11::string::string((string *)&opcode);
    std::operator>>(input,(string *)&opcode);
    lVar4 = std::__cxx11::string::size();
    if (lVar4 == 0) {
      local_8c = 3;
    }
    else {
      pcVar5 = (char *)std::__cxx11::string::c_str();
      local_90 = anon_unknown.dwarf_19009::SelectOpcode(pcVar5);
      switch(local_90) {
      default:
        std::__cxx11::string::string(local_e0);
        std::operator>>(input,local_e0);
        __range1._0_4_ = local_90;
        pcVar5 = (char *)std::__cxx11::string::c_str();
        local_e8 = anon_unknown.dwarf_19009::SelectValue(pcVar5);
        std::vector<deci::command_t,_std::allocator<deci::command_t>_>::push_back
                  (__return_storage_ptr__,(value_type *)&__range1);
        local_8c = 4;
        std::__cxx11::string::~string(local_e0);
        break;
      case OP_RESULT:
      case OP_RETURN:
        local_a0.opcode = local_90;
        pvVar10 = nothing_t::Instance();
        iVar3 = (*pvVar10->_vptr_value_t[2])();
        local_a0.arg = (value_t *)CONCAT44(extraout_var,iVar3);
        std::vector<deci::command_t,_std::allocator<deci::command_t>_>::push_back
                  (__return_storage_ptr__,&local_a0);
        break;
      case OP_LABEL:
        std::__cxx11::string::string(local_c0);
        std::operator>>(input,local_c0);
        sVar6 = std::vector<deci::command_t,_std::allocator<deci::command_t>_>::size
                          (__return_storage_ptr__);
        pmVar7 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                               *)local_58,(key_type *)local_c0);
        *pmVar7 = (mapped_type)sVar6;
        local_8c = 4;
        std::__cxx11::string::~string(local_c0);
        break;
      case OP_UNDEFINED:
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"Unknown opcode");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_8c = 0;
    }
    std::__cxx11::string::~string((string *)&opcode);
  } while (local_8c == 0);
  __end1 = std::vector<deci::command_t,_std::allocator<deci::command_t>_>::begin
                     (__return_storage_ptr__);
  item = (command_t *)
         std::vector<deci::command_t,_std::allocator<deci::command_t>_>::end(__return_storage_ptr__)
  ;
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<deci::command_t_*,_std::vector<deci::command_t,_std::allocator<deci::command_t>_>_>
                                     *)&item), bVar2) {
    pcVar8 = __gnu_cxx::
             __normal_iterator<deci::command_t_*,_std::vector<deci::command_t,_std::allocator<deci::command_t>_>_>
             ::operator*(&__end1);
    iVar3 = (*pcVar8->arg->_vptr_value_t[1])();
    if (iVar3 == 1) {
      it.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
      ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                 )pcVar8->arg;
      __x = string_t::Value_abi_cxx11_
                      ((string_t *)
                       it.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                       ._M_cur);
      local_120._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *)local_58,__x);
      local_128._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  *)local_58);
      bVar2 = std::__detail::operator!=(&local_120,&local_128);
      if (bVar2) {
        (*pcVar8->arg->_vptr_value_t[3])();
        ppVar9 = std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                               *)&local_120);
        number_t::number_t(&local_140,(double)ppVar9->second);
        pvVar10 = number_t::Copy(&local_140);
        pcVar8->arg = pvVar10;
        number_t::~number_t(&local_140);
      }
    }
    __gnu_cxx::
    __normal_iterator<deci::command_t_*,_std::vector<deci::command_t,_std::allocator<deci::command_t>_>_>
    ::operator++(&__end1);
  }
  labels._M_h._M_single_bucket._7_1_ = 1;
  local_8c = 1;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    *)local_58);
  if ((labels._M_h._M_single_bucket._7_1_ & 1) == 0) {
    std::vector<deci::command_t,_std::allocator<deci::command_t>_>::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

program_t::source_t AssembleProgram(std::istream& input) {
    program_t::source_t result;
    std::unordered_map<std::string, int> labels;

    while(!input.eof()) {
      std::string opcodeToken;

      input >> opcodeToken;

      if (opcodeToken.size() == 0) {
        break;
      }

      opcode_t opcode = SelectOpcode(opcodeToken.c_str());
      switch (opcode) {
      case OP_UNDEFINED:
        throw std::runtime_error("Unknown opcode");
      case OP_RESULT:
      case OP_RETURN:
        result.push_back({ opcode, nothing_t::Instance().Copy() });
        break;
      case OP_LABEL:
        {
          std::string labelToken;
          input >> labelToken;
          labels[labelToken] = result.size();
          break;
        }
      default:
        {
          std::string argToken;
          input >> argToken;
          result.push_back({ opcode, SelectValue(argToken.c_str()) });
          break;
        }
      }
    }

    // Fix label pointers
    for (auto& item: result) {
      if (item.arg->Type() == value_t::STRING) {
        string_t& str = static_cast<string_t&>(*item.arg);
        auto it = labels.find(str.Value());
        if (it != labels.end()) {
          item.arg->Delete();
          item.arg = number_t(it->second).Copy();
        }
      }
    }

    return result;
  }